

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O0

ConsCell * find_close_cell(conspage *page,LispPTR oldcell)

{
  uint local_28;
  uint local_24;
  uint prior;
  uint offset;
  uint oldoffset;
  LispPTR oldcell_local;
  conspage *page_local;
  
  local_24 = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  local_28 = 0;
  while( true ) {
    if (local_24 == 0) {
      return (ConsCell *)0x0;
    }
    if (((oldcell & 0xff) < local_24) && (local_24 <= (oldcell & 0xff) + 0xe)) break;
    local_28 = local_24;
    local_24 = *(uint *)((long)&page->cell6 + (ulong)local_24 * 2) >> 0x18;
  }
  if (local_28 == 0) {
    *(uint *)&page->field_0x8 =
         *(uint *)&page->field_0x8 & 0xff00ffff |
         (*(uint *)((long)&page->cell6 + (ulong)local_24 * 2) >> 0x18) << 0x10;
  }
  else {
    *(uint *)((long)&page->cell6 + (ulong)local_28 * 2) =
         *(uint *)((long)&page->cell6 + (ulong)local_28 * 2) & 0xffffff |
         *(uint *)((long)&page->cell6 + (ulong)local_24 * 2) & 0xff000000;
  }
  *(uint *)&page->field_0x8 =
       *(uint *)&page->field_0x8 & 0xffffff | ((*(uint *)&page->field_0x8 >> 0x18) - 1) * 0x1000000;
  return (ConsCell *)((long)&page->cell6 + (ulong)local_24 * 2);
}

Assistant:

static ConsCell *find_close_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;

  while (offset) {
    if ((offset > oldoffset) && (offset <= (oldoffset + 14))) {
      if (prior)
        ((freecons *)((DLword *)page + prior))->next_free =
            ((freecons *)((DLword *)page + offset))->next_free;
      else
        page->next_cell = ((freecons *)((DLword *)page + offset))->next_free;
      page->count -= 1;
      return (ConsCell *)((DLword *)page + offset);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}